

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O1

void __thiscall t_py_generator::generate_service_client(t_py_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *out;
  int *piVar1;
  undefined **ppuVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  t_type *returntype;
  char cVar6;
  long *plVar7;
  ostream *poVar8;
  long *plVar9;
  undefined **ppuVar10;
  size_type *psVar11;
  char *pcVar12;
  _func_int **pp_Var13;
  byte bVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  char *__end;
  _Alloc_hider _Var16;
  string argsname;
  t_struct noargs;
  string funname;
  string resultname;
  string messageType;
  string extends_client;
  t_function recv_function;
  string extends;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_5c0;
  undefined1 local_5a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_588;
  bool local_578;
  _Rb_tree_node_base local_568;
  size_t local_548;
  t_program *local_540;
  _Alloc_hider local_538;
  size_type local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  pointer local_518;
  pointer pptStack_510;
  pointer local_508;
  pointer pptStack_500;
  pointer local_4f8;
  undefined7 uStack_4f0;
  undefined4 uStack_4e9;
  int local_4e4;
  bool local_4e0;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  char *local_458;
  char *local_450;
  char local_448 [16];
  t_function local_438;
  string local_398;
  long *local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  char *local_270;
  long local_268;
  char local_260 [16];
  string local_250;
  string local_230;
  char *local_210;
  long local_208;
  char local_200 [16];
  string local_1f0;
  string local_1d0;
  char *local_1b0;
  long local_1a8;
  char local_1a0 [16];
  string local_190;
  string local_170;
  char *local_150;
  long local_148;
  char local_140 [16];
  string local_130;
  char *local_110;
  long local_108;
  char local_100 [16];
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"","");
  local_458 = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"","");
  if (tservice->extends_ == (t_service *)0x0) {
    if ((this->gen_zope_interface_ == true) &&
       ((this->gen_newstyle_ != false || (this->gen_dynamic_ == true)))) {
      std::__cxx11::string::_M_replace((ulong)&local_458,0,local_450,0x3a194f);
    }
  }
  else {
    type_name_abi_cxx11_((string *)local_5a0,this,&tservice->extends_->super_t_type);
    std::__cxx11::string::operator=((string *)&local_370,(string *)local_5a0);
    ppuVar2 = (undefined **)(local_5a0 + 0x10);
    if ((undefined **)local_5a0._0_8_ != ppuVar2) {
      operator_delete((void *)local_5a0._0_8_);
    }
    local_5a0._0_8_ = ppuVar2;
    if (this->gen_zope_interface_ == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_438
                     ,"(",&local_370);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_438);
      ppuVar10 = (undefined **)(plVar7 + 2);
      if ((undefined **)*plVar7 == ppuVar10) {
        local_5a0._16_8_ = *ppuVar10;
        aStack_588._M_allocated_capacity = plVar7[3];
      }
      else {
        local_5a0._16_8_ = *ppuVar10;
        local_5a0._0_8_ = (undefined **)*plVar7;
      }
      local_5a0._8_8_ = plVar7[1];
      *plVar7 = (long)ppuVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_458,(string *)local_5a0);
      if ((undefined **)local_5a0._0_8_ != ppuVar2) {
        operator_delete((void *)local_5a0._0_8_);
      }
      pp_Var13 = local_438.super_t_doc._vptr_t_doc;
      if (local_438.super_t_doc._vptr_t_doc ==
          (_func_int **)&local_438.super_t_doc.doc_._M_string_length) goto LAB_003157db;
    }
    else {
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_5a0,local_370._M_dataplus._M_p,
                 local_370._M_dataplus._M_p + local_370._M_string_length);
      std::__cxx11::string::append(local_5a0);
      std::__cxx11::string::operator=((string *)&local_458,(string *)local_5a0);
      pp_Var13 = (_func_int **)local_5a0._0_8_;
      if ((undefined **)local_5a0._0_8_ == ppuVar2) goto LAB_003157db;
    }
    operator_delete(pp_Var13);
  }
LAB_003157db:
  out = &this->f_service_;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (this->gen_zope_interface_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"@implementer(Iface)",0x13);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                        ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"class Client",0xc);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_458,(long)local_450);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"class Client(",0xd);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,local_458,(long)local_450);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Iface):",7);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  generate_python_docstring(this,(ostream *)out,(t_doc *)tservice);
  if (this->gen_twisted_ == true) {
    t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"def __init__(self, transport, oprot_factory):",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else if (this->gen_tornado_ == true) {
    t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"def __init__(self, transport, iprot_factory, oprot_factory=None):",0x41);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"def __init__(self, iprot, oprot=None):",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
    operator_delete((void *)local_5a0._0_8_);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  if (local_370._M_string_length == 0) {
    if (this->gen_twisted_ == false) {
      if (this->gen_tornado_ == true) {
        t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"self._transport = transport",0x1b);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_((string *)&local_438,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                            (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"self._iprot_factory = iprot_factory",0x23);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_4b8,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"self._oprot_factory = (oprot_factory if oprot_factory is not None",0x41);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_5c0,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_5c0._M_dataplus._M_p,local_5c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"                       else iprot_factory)",0x2a);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_478,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_478._M_dataplus._M_p,local_478._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"self._seqid = 0",0xf);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_498,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_498._M_dataplus._M_p,local_498._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"self._reqs = {}",0xf);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_4d8,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_4d8._M_dataplus._M_p,local_4d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"self._transport.io_loop.spawn_callback(self._start_receiving)",0x3d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          operator_delete(local_4d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p);
        }
      }
      else {
        t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"self._iprot = self._oprot = iprot",0x21);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_((string *)&local_438,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                            (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if oprot is not None:",0x15);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_4b8,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_5c0,this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_5c0._M_dataplus._M_p,local_5c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"self._oprot = oprot",0x13);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_478,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_478._M_dataplus._M_p,local_478._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"self._seqid = 0",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p);
      }
    }
    else {
      t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"self._transport = transport",0x1b);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_((string *)&local_438,&this->super_t_generator);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                          (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"self._oprot_factory = oprot_factory",0x23);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_4b8,&this->super_t_generator);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"self._seqid = 0",0xf);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_5c0,&this->super_t_generator);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_5c0._M_dataplus._M_p,local_5c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"self._reqs = {}",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
      operator_delete(local_5c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p);
    }
    if (local_438.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_438.super_t_doc.doc_._M_string_length) {
      operator_delete(local_438.super_t_doc._vptr_t_doc);
    }
  }
  else if (this->gen_twisted_ == false) {
    if (this->gen_tornado_ == true) {
      t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_370._M_dataplus._M_p,local_370._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,".Client.__init__(self, transport, iprot_factory, oprot_factory)",0x3f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    else {
      t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_370._M_dataplus._M_p,local_370._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,".Client.__init__(self, iprot, oprot)",0x24);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
  }
  else {
    t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_370._M_dataplus._M_p,local_370._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,".Client.__init__(self, transport, oprot_factory)",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
    operator_delete((void *)local_5a0._0_8_);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  if ((this->gen_tornado_ == true) && (local_370._M_string_length == 0)) {
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                        ::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_5a0._0_8_,local_5a0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"@gen.engine",0xb);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_((string *)&local_438,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                        (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"def _start_receiving(self):",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    psVar11 = &local_438.super_t_doc.doc_._M_string_length;
    if (local_438.super_t_doc._vptr_t_doc != (_func_int **)psVar11) {
      operator_delete(local_438.super_t_doc._vptr_t_doc);
    }
    if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
      operator_delete((void *)local_5a0._0_8_);
    }
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"while True:",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"try:",4);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_((string *)&local_438,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                        (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_4b8,this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"frame = yield self._transport.readFrame()",0x29);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_5c0,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_5c0._M_dataplus._M_p,local_5c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"except TTransport.TTransportException as e:",0x2b);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_478,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_478._M_dataplus._M_p,local_478._M_string_length);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_498,this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_498._M_dataplus._M_p,local_498._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"for future in self._reqs.values():",0x22);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_4d8,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_4d8._M_dataplus._M_p,local_4d8._M_string_length);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_398,this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_398._M_dataplus._M_p,local_398._M_string_length);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_2d0,this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"future.set_exception(e)",0x17);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_2f0,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_310,this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_310._M_dataplus._M_p,local_310._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"self._reqs = {}",0xf);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_330,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_330._M_dataplus._M_p,local_330._M_string_length);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_350,this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_350._M_dataplus._M_p,local_350._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return",6);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_2b0,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"tr = TTransport.TMemoryBuffer(frame)",0x24);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_50,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"iprot = self._iprot_factory.getProtocol(tr)",0x2b);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"(fname, mtype, rseqid) = iprot.readMessageBegin()",0x31);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"method = getattr(self, \'recv_\' + fname)",0x27);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_b0,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"future = self._reqs.pop(rseqid, None)",0x25);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_d0,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if not future:",0xe);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_f0,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_110,this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_110,local_108);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"# future has already been discarded",0x23);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_130,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_130._M_dataplus._M_p,local_130._M_string_length);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_150,this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_150,local_148);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"continue",8);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_170,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"try:",4);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_190,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_190._M_dataplus._M_p,local_190._M_string_length);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_1b0,this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_1b0,local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"result = method(iprot, mtype, rseqid)",0x25);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_1d0,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"except Exception as e:",0x16);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_1f0,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_210,this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_210,local_208);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"future.set_exception(e)",0x17);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_230,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"else:",5);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_250,&this->super_t_generator);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_250._M_dataplus._M_p,local_250._M_string_length);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_270,this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_270,local_268);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"future.set_result(result)",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_270 != local_260) {
      operator_delete(local_270);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if (local_210 != local_200) {
      operator_delete(local_210);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if (local_1b0 != local_1a0) {
      operator_delete(local_1b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if (local_150 != local_140) {
      operator_delete(local_150);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if (local_110 != local_100) {
      operator_delete(local_110);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
      operator_delete(local_4d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
      operator_delete(local_5c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p);
    }
    if (local_438.super_t_doc._vptr_t_doc != (_func_int **)psVar11) {
      operator_delete(local_438.super_t_doc._vptr_t_doc);
    }
    if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
      operator_delete((void *)local_5a0._0_8_);
    }
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -2;
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_2b0,&tservice->functions_
            );
  _Var16._M_p = local_2b0._M_dataplus._M_p;
  if (local_2b0._M_dataplus._M_p != (pointer)local_2b0._M_string_length) {
    do {
      paVar15 = &local_4d8.field_2;
      lVar4 = *(long *)(*(long *)_Var16._M_p + 0x88);
      local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
      lVar5 = *(long *)(*(long *)_Var16._M_p + 0x68);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4b8,lVar5,*(long *)(*(long *)_Var16._M_p + 0x70) + lVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"def ",4);
      function_signature_abi_cxx11_((string *)local_5a0,this,*(t_function **)_Var16._M_p,false);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_5a0._0_8_,local_5a0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
        operator_delete((void *)local_5a0._0_8_);
      }
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      generate_python_docstring
                (this,(ostream *)out,*(t_doc **)_Var16._M_p,
                 *(t_struct **)&(*(t_doc **)_Var16._M_p)[2].has_doc_,"Parameters");
      if (this->gen_twisted_ == true) {
        poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"seqid = self._seqid = self._seqid + 1",0x25);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"self._reqs[seqid] = defer.Deferred()",0x24);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"d = defer.maybeDeferred(self.send_",0x22);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
      }
      else {
        if (this->gen_tornado_ == true) {
          poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"self._seqid += 1",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if (*(char *)(*(long *)_Var16._M_p + 0x99) == '\0') {
            poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)out);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"future = self._reqs[self._seqid] = concurrent.Future()",0x36);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
          }
          poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"self.send_",10);
        }
        else {
          poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"self.send_",10);
        }
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
      }
      plVar7 = *(long **)(lVar4 + 0x88);
      local_378 = (long *)_Var16._M_p;
      if (plVar7 != *(long **)(lVar4 + 0x90)) {
        bVar14 = this->gen_twisted_ ^ 1;
        do {
          if ((bVar14 & 1) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
          }
          else {
            bVar14 = 0;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)out,*(char **)(*plVar7 + 0x68),*(long *)(*plVar7 + 0x70));
          plVar7 = plVar7 + 1;
        } while (plVar7 != *(long **)(lVar4 + 0x90));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,")",1);
      plVar7 = local_378;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      if ((*(char *)(*plVar7 + 0x99) == '\0') && (this->gen_twisted_ == false)) {
        if (this->gen_tornado_ == true) {
          poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return future",0xd);
        }
        else {
          t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
          if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
            operator_delete((void *)local_5a0._0_8_);
          }
          cVar6 = (**(code **)(**(long **)(*plVar7 + 0x60) + 0x20))();
          if (cVar6 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"return ",7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"self.recv_",10);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"()",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      iVar3 = (this->super_t_generator).indent_;
      (this->super_t_generator).indent_ = iVar3 + -1;
      if (this->gen_twisted_ == true) {
        (this->super_t_generator).indent_ = iVar3;
        poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"d.addCallbacks(",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"callback=self.cb_send_",0x16);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_((string *)&local_438,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                            (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"callbackArgs=(seqid,),",0x16);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_5c0,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_5c0._M_dataplus._M_p,local_5c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"errback=self.eb_send_",0x15);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_478,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_478._M_dataplus._M_p,local_478._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"errbackArgs=(seqid,))",0x15);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        if (local_438.super_t_doc._vptr_t_doc !=
            (_func_int **)&local_438.super_t_doc.doc_._M_string_length) {
          operator_delete(local_438.super_t_doc._vptr_t_doc);
        }
        if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
          operator_delete((void *)local_5a0._0_8_);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return d",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_string_length);
        poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"def cb_send_",0xc);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(self, _, seqid):",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        if (*(char *)(*plVar7 + 0x99) == '\x01') {
          t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"d = self._reqs.pop(seqid)",0x19);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_((string *)&local_438,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                              (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"d.callback(None)",0x10);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_5c0,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_5c0._M_dataplus._M_p,local_5c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return d",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
            operator_delete(local_5c0._M_dataplus._M_p);
          }
          if (local_438.super_t_doc._vptr_t_doc !=
              (_func_int **)&local_438.super_t_doc.doc_._M_string_length) {
            operator_delete(local_438.super_t_doc._vptr_t_doc);
          }
        }
        else {
          t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return self._reqs[seqid]",0x18)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
          operator_delete((void *)local_5a0._0_8_);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_string_length);
        poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"def eb_send_",0xc);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(self, f, seqid):",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"d = self._reqs.pop(seqid)",0x19);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_((string *)&local_438,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                            (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"d.errback(f)",0xc);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_5c0,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_5c0._M_dataplus._M_p,local_5c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return d",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        if (local_438.super_t_doc._vptr_t_doc !=
            (_func_int **)&local_438.super_t_doc.doc_._M_string_length) {
          operator_delete(local_438.super_t_doc._vptr_t_doc);
        }
        if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
          operator_delete((void *)local_5a0._0_8_);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"def send_",9);
      function_signature_abi_cxx11_((string *)local_5a0,this,(t_function *)*plVar7,false);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_5a0._0_8_,local_5a0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
        operator_delete((void *)local_5a0._0_8_);
      }
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
      lVar5 = *(long *)(*plVar7 + 0x68);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5c0,lVar5,*(long *)(*plVar7 + 0x70) + lVar5);
      std::__cxx11::string::append((char *)&local_5c0);
      pcVar12 = "TMessageType.CALL";
      if (*(byte *)(*plVar7 + 0x99) != 0) {
        pcVar12 = "TMessageType.ONEWAY";
      }
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_478,pcVar12,pcVar12 + (ulong)*(byte *)(*plVar7 + 0x99) * 2 + 0x11)
      ;
      if ((this->gen_twisted_ == false) && (this->gen_tornado_ != true)) {
        t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"self._oprot.writeMessageBegin(\'",0x1f);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,*(char **)(*plVar7 + 0x68),*(long *)(*plVar7 + 0x70));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', ",3);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_478._M_dataplus._M_p,local_478._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", self._seqid)",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      else {
        t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"oprot = self._oprot_factory.getProtocol(self._transport)",0x38);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_((string *)&local_438,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                            (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"oprot.writeMessageBegin(\'",0x19)
        ;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,*(char **)(*plVar7 + 0x68),*(long *)(*plVar7 + 0x70));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', ",3);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_478._M_dataplus._M_p,local_478._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", self._seqid)",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if (local_438.super_t_doc._vptr_t_doc !=
            (_func_int **)&local_438.super_t_doc.doc_._M_string_length) {
          operator_delete(local_438.super_t_doc._vptr_t_doc);
        }
      }
      if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
        operator_delete((void *)local_5a0._0_8_);
      }
      t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"args = ",7);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_5c0._M_dataplus._M_p,local_5c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"()",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
        operator_delete((void *)local_5a0._0_8_);
      }
      for (plVar7 = *(long **)(lVar4 + 0x88); plVar7 != *(long **)(lVar4 + 0x90);
          plVar7 = plVar7 + 1) {
        t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"args.",5);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,*(char **)(*plVar7 + 0x68),*(long *)(*plVar7 + 0x70));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,*(char **)(*plVar7 + 0x68),*(long *)(*plVar7 + 0x70));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
          operator_delete((void *)local_5a0._0_8_);
        }
      }
      if ((this->gen_twisted_ == false) && (this->gen_tornado_ != true)) {
        t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
        plVar7 = local_378;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"args.write(self._oprot)",0x17);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_((string *)&local_438,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                            (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"self._oprot.writeMessageEnd()",0x1d);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_498,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_498._M_dataplus._M_p,local_498._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"self._oprot.trans.flush()",0x19);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      else {
        t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
        plVar7 = local_378;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"args.write(oprot)",0x11);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_((string *)&local_438,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                            (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"oprot.writeMessageEnd()",0x17);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_498,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_498._M_dataplus._M_p,local_498._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"oprot.trans.flush()",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p);
      }
      if (local_438.super_t_doc._vptr_t_doc !=
          (_func_int **)&local_438.super_t_doc.doc_._M_string_length) {
        operator_delete(local_438.super_t_doc._vptr_t_doc);
      }
      if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
        operator_delete((void *)local_5a0._0_8_);
      }
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      if (*(char *)(*plVar7 + 0x99) == '\0') {
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        lVar4 = *(long *)(*plVar7 + 0x68);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_498,lVar4,*(long *)(*plVar7 + 0x70) + lVar4);
        std::__cxx11::string::append((char *)&local_498);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_string_length);
        if ((this->gen_twisted_ == false) && (this->gen_tornado_ != true)) {
          local_540 = (this->super_t_generator).program_;
          local_5a0._8_8_ = &aStack_588;
          local_5a0._16_8_ = (undefined *)0x0;
          aStack_588._0_8_ = aStack_588._0_8_ & 0xffffffffffffff00;
          local_578 = false;
          local_568._M_color = _S_red;
          local_568._M_parent = (_Base_ptr)0x0;
          local_568._M_left = &local_568;
          local_548 = 0;
          local_538._M_p = (pointer)&local_528;
          local_530 = 0;
          local_528._M_local_buf[0] = '\0';
          local_5a0._0_8_ = &PTR__t_struct_0040eef0;
          local_4e4 = 0;
          local_4e0 = false;
          local_4f8 = (pointer)0x0;
          uStack_4f0 = 0;
          uStack_4e9 = 0;
          local_508 = (pointer)0x0;
          pptStack_500 = (pointer)0x0;
          local_518 = (pointer)0x0;
          pptStack_510 = (pointer)0x0;
          returntype = *(t_type **)(*plVar7 + 0x60);
          local_568._M_right = local_568._M_left;
          local_4d8._M_dataplus._M_p = (pointer)paVar15;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"recv_","");
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_4d8,*(ulong *)(*plVar7 + 0x68));
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          psVar11 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_290.field_2._M_allocated_capacity = *psVar11;
            local_290.field_2._8_8_ = plVar9[3];
          }
          else {
            local_290.field_2._M_allocated_capacity = *psVar11;
            local_290._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_290._M_string_length = plVar9[1];
          *plVar9 = (long)psVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          t_function::t_function(&local_438,returntype,&local_290,(t_struct *)local_5a0,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != paVar15) {
            operator_delete(local_4d8._M_dataplus._M_p);
          }
          t_generator::indent_abi_cxx11_(&local_4d8,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,local_4d8._M_dataplus._M_p,local_4d8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"def ",4);
          function_signature_abi_cxx11_(&local_398,this,&local_438,false);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_398._M_dataplus._M_p,local_398._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != paVar15) {
            operator_delete(local_4d8._M_dataplus._M_p);
          }
          t_function::~t_function(&local_438);
          local_5a0._0_8_ = &PTR__t_struct_0040eef0;
          if (pptStack_500 != (pointer)0x0) {
            operator_delete(pptStack_500);
          }
          if (local_518 != (pointer)0x0) {
            operator_delete(local_518);
          }
          t_type::~t_type((t_type *)local_5a0);
        }
        else {
          t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"def recv_",9);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)(*plVar7 + 0x68),*(long *)(*plVar7 + 0x70));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"(self, iprot, mtype, rseqid):",0x1d);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
            operator_delete((void *)local_5a0._0_8_);
          }
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        if (this->gen_twisted_ == true) {
          t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"d = self._reqs.pop(rseqid)",0x1a);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_00318515:
          if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
            operator_delete((void *)local_5a0._0_8_);
          }
        }
        else if (this->gen_tornado_ == false) {
          t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"iprot = self._iprot",0x13);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_((string *)&local_438,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                              (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"(fname, mtype, rseqid) = iprot.readMessageBegin()",0x31);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if (local_438.super_t_doc._vptr_t_doc !=
              (_func_int **)&local_438.super_t_doc.doc_._M_string_length) {
            operator_delete(local_438.super_t_doc._vptr_t_doc);
          }
          goto LAB_00318515;
        }
        t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"if mtype == TMessageType.EXCEPTION:",0x23);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_((string *)&local_438,&this->super_t_generator);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                            (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_4d8,this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_4d8._M_dataplus._M_p,local_4d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"x = TApplicationException()",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != paVar15) {
          operator_delete(local_4d8._M_dataplus._M_p);
        }
        if (local_438.super_t_doc._vptr_t_doc !=
            (_func_int **)&local_438.super_t_doc.doc_._M_string_length) {
          operator_delete(local_438.super_t_doc._vptr_t_doc);
        }
        if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
          operator_delete((void *)local_5a0._0_8_);
        }
        if (this->gen_twisted_ == true) {
          t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
          (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_438,this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                              (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x.read(iprot)",0xd);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_4d8,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_4d8._M_dataplus._M_p,local_4d8._M_string_length);
          (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_398,this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_398._M_dataplus._M_p,local_398._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"iprot.readMessageEnd()",0x16);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
          (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_2f0,this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return d.errback(x)",0x13);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_310,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_310._M_dataplus._M_p,local_310._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"result = ",9);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_498._M_dataplus._M_p,local_498._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"()",2);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_330,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_330._M_dataplus._M_p,local_330._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"result.read(iprot)",0x12);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_350,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_350._M_dataplus._M_p,local_350._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"iprot.readMessageEnd()",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        else {
          t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
          (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_438,this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                              (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x.read(iprot)",0xd);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_4d8,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_4d8._M_dataplus._M_p,local_4d8._M_string_length);
          (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_398,this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_398._M_dataplus._M_p,local_398._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"iprot.readMessageEnd()",0x16);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
          (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_2f0,this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"raise x",7);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_310,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_310._M_dataplus._M_p,local_310._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"result = ",9);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_498._M_dataplus._M_p,local_498._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"()",2);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_330,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_330._M_dataplus._M_p,local_330._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"result.read(iprot)",0x12);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_350,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_350._M_dataplus._M_p,local_350._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"iprot.readMessageEnd()",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != paVar15) {
          operator_delete(local_4d8._M_dataplus._M_p);
        }
        if (local_438.super_t_doc._vptr_t_doc !=
            (_func_int **)&local_438.super_t_doc.doc_._M_string_length) {
          operator_delete(local_438.super_t_doc._vptr_t_doc);
        }
        if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
          operator_delete((void *)local_5a0._0_8_);
        }
        cVar6 = (**(code **)(**(long **)(*plVar7 + 0x60) + 0x20))();
        if (cVar6 == '\0') {
          t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"if result.success is not None:",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
            operator_delete((void *)local_5a0._0_8_);
          }
          if (this->gen_twisted_ == true) {
            t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
            (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_438,this);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                                (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"return d.callback(result.success)",0x21);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
          }
          else {
            t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
            (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_438,this);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                                (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return result.success",0x15);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
          }
          if (local_438.super_t_doc._vptr_t_doc !=
              (_func_int **)&local_438.super_t_doc.doc_._M_string_length) {
            operator_delete(local_438.super_t_doc._vptr_t_doc);
          }
          if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
            operator_delete((void *)local_5a0._0_8_);
          }
        }
        lVar4 = *(long *)(*plVar7 + 0x90);
        for (plVar9 = *(long **)(lVar4 + 0x88); plVar7 = local_378,
            plVar9 != *(long **)(lVar4 + 0x90); plVar9 = plVar9 + 1) {
          lVar5 = *plVar9;
          t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if result.",10);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)(lVar5 + 0x68),*(long *)(lVar5 + 0x70));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," is not None:",0xd);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
            operator_delete((void *)local_5a0._0_8_);
          }
          if (this->gen_twisted_ == true) {
            t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
            (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_438,this);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                                (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"return d.errback(result.",0x18);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,*(char **)(lVar5 + 0x68),*(long *)(lVar5 + 0x70));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
          }
          else {
            t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
            (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_438,this);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)local_438.super_t_doc._vptr_t_doc,
                                (long)local_438.super_t_doc.doc_._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"raise result.",0xd);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,*(char **)(lVar5 + 0x68),*(long *)(lVar5 + 0x70));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"",0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
          }
          if (local_438.super_t_doc._vptr_t_doc !=
              (_func_int **)&local_438.super_t_doc.doc_._M_string_length) {
            operator_delete(local_438.super_t_doc._vptr_t_doc);
          }
          if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
            operator_delete((void *)local_5a0._0_8_);
          }
        }
        cVar6 = (**(code **)(**(long **)(*local_378 + 0x60) + 0x20))();
        if (cVar6 == '\0') {
          if (this->gen_twisted_ == false) {
            t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"raise TApplicationException(TApplicationException.MISSING_RESULT, \""
                       ,0x43);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,*(char **)(*plVar7 + 0x68),*(long *)(*plVar7 + 0x70));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," failed: unknown result\")",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
          }
          else {
            t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,
                       "return d.errback(TApplicationException(TApplicationException.MISSING_RESULT, \""
                       ,0x4e);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,*(char **)(*plVar7 + 0x68),*(long *)(*plVar7 + 0x70));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," failed: unknown result\"))",0x1a);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
          }
        }
        else if (this->gen_twisted_ == false) {
          t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        else {
          t_generator::indent_abi_cxx11_((string *)local_5a0,&this->super_t_generator);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,(char *)local_5a0._0_8_,local_5a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return d.callback(None)",0x17);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
          operator_delete((void *)local_5a0._0_8_);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
        operator_delete(local_5c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p);
      }
      _Var16._M_p = (pointer)(plVar7 + 1);
    } while (plVar7 + 1 != (long *)local_2b0._M_string_length);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  if ((long *)local_2b0._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if (local_458 != local_448) {
    operator_delete(local_458);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_py_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    if (gen_zope_interface_) {
      extends_client = "(" + extends + ".Client)";
    } else {
      extends_client = extends + ".Client, ";
    }
  } else {
    if (gen_zope_interface_ && (gen_newstyle_ || gen_dynamic_)) {
      extends_client = "(object)";
    }
  }

  f_service_ << endl << endl;

  if (gen_zope_interface_) {
    f_service_ << "@implementer(Iface)" << endl
               << "class Client" << extends_client << ":" << endl
               << endl;
  } else {
    f_service_ << "class Client(" << extends_client << "Iface):" << endl;
  }
  indent_up();
  generate_python_docstring(f_service_, tservice);

  // Constructor function
  if (gen_twisted_) {
    f_service_ << indent() << "def __init__(self, transport, oprot_factory):" << endl;
  } else if (gen_tornado_) {
    f_service_ << indent()
               << "def __init__(self, transport, iprot_factory, oprot_factory=None):" << endl;
  } else {
    f_service_ << indent() << "def __init__(self, iprot, oprot=None):" << endl;
  }
  indent_up();
  if (extends.empty()) {
    if (gen_twisted_) {
      f_service_ << indent() << "self._transport = transport" << endl
                 << indent() << "self._oprot_factory = oprot_factory" << endl
                 << indent() << "self._seqid = 0" << endl
                 << indent() << "self._reqs = {}" << endl;
    } else if (gen_tornado_) {
      f_service_ << indent() << "self._transport = transport" << endl
                 << indent() << "self._iprot_factory = iprot_factory" << endl
                 << indent() << "self._oprot_factory = (oprot_factory if oprot_factory is not None"
                 << endl
                 << indent() << "                       else iprot_factory)" << endl
                 << indent() << "self._seqid = 0" << endl
                 << indent() << "self._reqs = {}" << endl
                 << indent() << "self._transport.io_loop.spawn_callback(self._start_receiving)"
                 << endl;
    } else {
      f_service_ << indent() << "self._iprot = self._oprot = iprot" << endl
                 << indent() << "if oprot is not None:" << endl
                 << indent() << indent_str() << "self._oprot = oprot" << endl
                 << indent() << "self._seqid = 0" << endl;
    }
  } else {
    if (gen_twisted_) {
      f_service_ << indent() << extends
                 << ".Client.__init__(self, transport, oprot_factory)" << endl;
    } else if (gen_tornado_) {
      f_service_ << indent() << extends
                 << ".Client.__init__(self, transport, iprot_factory, oprot_factory)" << endl;
    } else {
      f_service_ << indent() << extends << ".Client.__init__(self, iprot, oprot)" << endl;
    }
  }
  indent_down();

  if (gen_tornado_ && extends.empty()) {
    f_service_ << endl <<
      indent() << "@gen.engine" << endl <<
      indent() << "def _start_receiving(self):" << endl;
    indent_up();
    indent(f_service_) << "while True:" << endl;
    indent_up();
    f_service_ << indent() << "try:" << endl
               << indent() << indent_str() << "frame = yield self._transport.readFrame()" << endl
               << indent() << "except TTransport.TTransportException as e:" << endl
               << indent() << indent_str() << "for future in self._reqs.values():" << endl
               << indent() << indent_str() << indent_str() << "future.set_exception(e)" << endl
               << indent() << indent_str() << "self._reqs = {}" << endl
               << indent() << indent_str() << "return" << endl
               << indent() << "tr = TTransport.TMemoryBuffer(frame)" << endl
               << indent() << "iprot = self._iprot_factory.getProtocol(tr)" << endl
               << indent() << "(fname, mtype, rseqid) = iprot.readMessageBegin()" << endl
               << indent() << "method = getattr(self, 'recv_' + fname)" << endl
               << indent() << "future = self._reqs.pop(rseqid, None)" << endl
               << indent() << "if not future:" << endl
               << indent() << indent_str() << "# future has already been discarded" << endl
               << indent() << indent_str() << "continue" << endl
               << indent() << "try:" << endl
               << indent() << indent_str() << "result = method(iprot, mtype, rseqid)" << endl
               << indent() << "except Exception as e:" << endl
               << indent() << indent_str() << "future.set_exception(e)" << endl
               << indent() << "else:" << endl
               << indent() << indent_str() << "future.set_result(result)" << endl;
    indent_down();
    indent_down();
  }

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* arg_struct = (*f_iter)->get_arglist();
    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator fld_iter;
    string funname = (*f_iter)->get_name();

    f_service_ << endl;
    // Open function
    indent(f_service_) << "def " << function_signature(*f_iter, false) << ":" << endl;
    indent_up();
    generate_python_docstring(f_service_, (*f_iter));
    if (gen_twisted_) {
      indent(f_service_) << "seqid = self._seqid = self._seqid + 1" << endl;
      indent(f_service_) << "self._reqs[seqid] = defer.Deferred()" << endl << endl;
      indent(f_service_) << "d = defer.maybeDeferred(self.send_" << funname;

    } else if (gen_tornado_) {
      indent(f_service_) << "self._seqid += 1" << endl;
      if (!(*f_iter)->is_oneway()) {
        indent(f_service_) << "future = self._reqs[self._seqid] = concurrent.Future()" << endl;
      }
      indent(f_service_) << "self.send_" << funname << "(";

    } else {
      indent(f_service_) << "self.send_" << funname << "(";
    }

    bool first = true;
    if (gen_twisted_) {
      // we need a leading comma if there are args, since it's called as maybeDeferred(funcname,
      // arg)
      first = false;
    }
    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << (*fld_iter)->get_name();
    }

    f_service_ << ")" << endl;

    if (!(*f_iter)->is_oneway()) {
      if (gen_twisted_) {
        // nothing. See the next block.
      } else if (gen_tornado_) {
        indent(f_service_) << "return future" << endl;
      } else {
        f_service_ << indent();
        if (!(*f_iter)->get_returntype()->is_void()) {
          f_service_ << "return ";
        }
        f_service_ << "self.recv_" << funname << "()" << endl;
      }
    }
    indent_down();

    if (gen_twisted_) {
      // This block injects the body of the send_<> method for twisted (and a cb/eb pair)
      indent_up();
      indent(f_service_) << "d.addCallbacks(" << endl;

      indent_up();
      f_service_ << indent() << "callback=self.cb_send_" << funname << "," << endl << indent()
                 << "callbackArgs=(seqid,)," << endl << indent() << "errback=self.eb_send_"
                 << funname << "," << endl << indent() << "errbackArgs=(seqid,))" << endl;
      indent_down();

      indent(f_service_) << "return d" << endl;
      indent_down();
      f_service_ << endl;

      indent(f_service_) << "def cb_send_" << funname << "(self, _, seqid):" << endl;
      indent_up();
      if ((*f_iter)->is_oneway()) {
        // if one-way, fire the deferred & remove it from _reqs
        f_service_ << indent() << "d = self._reqs.pop(seqid)" << endl << indent()
                   << "d.callback(None)" << endl << indent() << "return d" << endl;
      } else {
        f_service_ << indent() << "return self._reqs[seqid]" << endl;
      }
      indent_down();
      f_service_ << endl;

      // add an errback to fail the request if the call to send_<> raised an exception
      indent(f_service_) << "def eb_send_" << funname << "(self, f, seqid):" << endl;
      indent_up();
      f_service_ << indent() << "d = self._reqs.pop(seqid)" << endl << indent() << "d.errback(f)"
                 << endl << indent() << "return d" << endl;
      indent_down();
    }

    f_service_ << endl;
    indent(f_service_) << "def send_" << function_signature(*f_iter, false) << ":" << endl;
    indent_up();

    std::string argsname = (*f_iter)->get_name() + "_args";
    std::string messageType = (*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL";

    // Serialize the request header
    if (gen_twisted_ || gen_tornado_) {
      f_service_ << indent() << "oprot = self._oprot_factory.getProtocol(self._transport)" << endl
                 << indent() << "oprot.writeMessageBegin('" << (*f_iter)->get_name() << "', "
                 << messageType << ", self._seqid)" << endl;
    } else {
      f_service_ << indent() << "self._oprot.writeMessageBegin('" << (*f_iter)->get_name() << "', "
                 << messageType << ", self._seqid)" << endl;
    }

    f_service_ << indent() << "args = " << argsname << "()" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << "args." << (*fld_iter)->get_name() << " = "
                 << (*fld_iter)->get_name() << endl;
    }

    // Write to the stream
    if (gen_twisted_ || gen_tornado_) {
      f_service_ << indent() << "args.write(oprot)" << endl << indent() << "oprot.writeMessageEnd()"
                 << endl << indent() << "oprot.trans.flush()" << endl;
    } else {
      f_service_ << indent() << "args.write(self._oprot)" << endl << indent()
                 << "self._oprot.writeMessageEnd()" << endl << indent()
                 << "self._oprot.trans.flush()" << endl;
    }

    indent_down();

    if (!(*f_iter)->is_oneway()) {
      std::string resultname = (*f_iter)->get_name() + "_result";
      // Open function
      f_service_ << endl;
      if (gen_twisted_ || gen_tornado_) {
        f_service_ << indent() << "def recv_" << (*f_iter)->get_name()
                   << "(self, iprot, mtype, rseqid):" << endl;
      } else {
        t_struct noargs(program_);
        t_function recv_function((*f_iter)->get_returntype(),
                                 string("recv_") + (*f_iter)->get_name(),
                                 &noargs);
        f_service_ << indent() << "def " << function_signature(&recv_function) << ":" << endl;
      }
      indent_up();

      // TODO(mcslee): Validate message reply here, seq ids etc.

      if (gen_twisted_) {
        f_service_ << indent() << "d = self._reqs.pop(rseqid)" << endl;
      } else if (gen_tornado_) {
      } else {
        f_service_ << indent() << "iprot = self._iprot" << endl << indent()
                   << "(fname, mtype, rseqid) = iprot.readMessageBegin()" << endl;
      }

      f_service_ << indent() << "if mtype == TMessageType.EXCEPTION:" << endl
                 << indent() << indent_str() << "x = TApplicationException()" << endl;

      if (gen_twisted_) {
        f_service_ << indent() << indent_str() << "x.read(iprot)" << endl << indent()
                   << indent_str() << "iprot.readMessageEnd()" << endl << indent() << indent_str() << "return d.errback(x)"
                   << endl << indent() << "result = " << resultname << "()" << endl << indent()
                   << "result.read(iprot)" << endl << indent() << "iprot.readMessageEnd()" << endl;
      } else {
        f_service_ << indent() << indent_str() << "x.read(iprot)" << endl << indent()
                   << indent_str() << "iprot.readMessageEnd()" << endl << indent() << indent_str() << "raise x" << endl
                   << indent() << "result = " << resultname << "()" << endl << indent()
                   << "result.read(iprot)" << endl << indent() << "iprot.readMessageEnd()" << endl;
      }

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        f_service_ << indent() << "if result.success is not None:" << endl;
        if (gen_twisted_) {
          f_service_ << indent() << indent_str() << "return d.callback(result.success)" << endl;
        } else {
          f_service_ << indent() << indent_str() << "return result.success" << endl;
        }
      }

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();
      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        const string& xname = (*x_iter)->get_name();
        f_service_ << indent() << "if result." << xname << " is not None:" << endl;
        if (gen_twisted_) {
          f_service_ << indent() << indent_str() << "return d.errback(result." << xname << ")"
                     << endl;
        } else {
          f_service_ << indent() << indent_str() << "raise result." << xname << "" << endl;
        }
      }

      // Careful, only return _result if not a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        if (gen_twisted_) {
          f_service_ << indent() << "return d.callback(None)" << endl;
        } else {
          f_service_ << indent() << "return" << endl;
        }
      } else {
        if (gen_twisted_) {
          f_service_
              << indent()
              << "return d.errback(TApplicationException(TApplicationException.MISSING_RESULT, \""
              << (*f_iter)->get_name() << " failed: unknown result\"))" << endl;
        } else {
          f_service_ << indent()
                     << "raise TApplicationException(TApplicationException.MISSING_RESULT, \""
                     << (*f_iter)->get_name() << " failed: unknown result\")" << endl;
        }
      }

      // Close function
      indent_down();
    }
  }

  indent_down();
}